

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringReplaceHelper.cxx
# Opt level: O0

void __thiscall
cmStringReplaceHelper::cmStringReplaceHelper
          (cmStringReplaceHelper *this,string *regex,string *replace_expr,cmMakefile *makefile)

{
  cmMakefile *makefile_local;
  string *replace_expr_local;
  string *regex_local;
  cmStringReplaceHelper *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->RegExString,(string *)regex);
  cmsys::RegularExpression::RegularExpression(&this->RegularExpression,regex);
  this->ValidReplaceExpression = true;
  std::__cxx11::string::string((string *)&this->ReplaceExpression,(string *)replace_expr);
  std::
  vector<cmStringReplaceHelper::RegexReplacement,_std::allocator<cmStringReplaceHelper::RegexReplacement>_>
  ::vector(&this->Replacements);
  this->Makefile = makefile;
  ParseReplaceExpression(this);
  return;
}

Assistant:

cmStringReplaceHelper::cmStringReplaceHelper(const std::string& regex,
                                             std::string replace_expr,
                                             cmMakefile* makefile)
  : RegExString(regex)
  , RegularExpression(regex)
  , ReplaceExpression(std::move(replace_expr))
  , Makefile(makefile)
{
  this->ParseReplaceExpression();
}